

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O3

int luaD_rawrunprotected(lua_State *L,Pfunc f,void *ud)

{
  unsigned_short uVar1;
  lua_longjmp lj;
  lua_longjmp local_20;
  
  uVar1 = L->nCcalls;
  local_20.status = 0;
  local_20.previous = L->errorJmp;
  L->errorJmp = &local_20;
  (*f)(L,ud);
  L->errorJmp = local_20.previous;
  L->nCcalls = uVar1;
  return local_20.status;
}

Assistant:

int luaD_rawrunprotected (lua_State *L, Pfunc f, void *ud) {
  unsigned short oldnCcalls = L->nCcalls;
  struct lua_longjmp lj;
  lj.status = LUA_OK;
  lj.previous = L->errorJmp;  /* chain new error handler */
  L->errorJmp = &lj;
  LUAI_TRY(L, &lj,
    (*f)(L, ud);
  );
  L->errorJmp = lj.previous;  /* restore old error handler */
  L->nCcalls = oldnCcalls;
  return lj.status;
}